

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_cstring_type_spec<char,fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  char in_DIL;
  error_handler *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  
  if ((in_DIL == '\0') || (in_DIL == 's')) {
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::cstring_spec_handler::on_string((cstring_spec_handler *)0x2d34ee);
  }
  else if (in_DIL == 'p') {
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::cstring_spec_handler::on_pointer((cstring_spec_handler *)0x2d3504);
  }
  else {
    error_handler::on_error(unaff_retaddr,(char *)CONCAT17(in_DIL,in_stack_fffffffffffffff8));
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler &&handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}